

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

uint32_t phf_g<std::__cxx11::string>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
                   uint32_t seed)

{
  uint32_t uVar1;
  string local_38;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t h1;
  uint32_t seed_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  
  local_18 = seed;
  local_14 = seed;
  _h1 = k;
  std::__cxx11::string::string((string *)&local_38,(string *)k);
  local_18 = phf_round32(&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  uVar1 = phf_mix32(local_18);
  return uVar1;
}

Assistant:

static inline uint32_t phf_g(T k, uint32_t seed) {
	uint32_t h1 = seed;

	h1 = phf_round32(k, h1);

	return phf_mix32(h1);
}